

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O2

char * filename_cut(char *line,size_t len)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  
  if (line == (char *)0x0) {
    __assert_fail("line",
                  "/workspace/llm4binary/github/license_c_cmakelists/thpatch[P]thtk/thanm.old/thanm.c"
                  ,0x397,"char *filename_cut(char *, size_t)");
  }
  pcVar4 = line + len;
  for (; (pcVar5 = pcVar4, len != 0 && ((*line == ' ' || (pcVar5 = line, *line == '\t'))));
      line = line + 1) {
    len = len - 1;
  }
  pcVar4 = pcVar5;
  for (sVar3 = 0; len != sVar3; sVar3 = sVar3 + 1) {
    cVar1 = pcVar5[sVar3];
    pcVar2 = pcVar4;
    if (((cVar1 != '\t') && (cVar1 != ' ')) && (pcVar2 = pcVar5 + sVar3, cVar1 == '\n')) break;
    pcVar4 = pcVar2;
  }
  pcVar4[len != sVar3] = '\0';
  return pcVar5;
}

Assistant:

static char*
filename_cut(
    char *line,
    size_t len)
{
    char *p = line;

    assert(line);

    if(len == 0) {
        return line;
    }

    /* isspace(3) is only asking for trouble; we don't parse Unicode anyway. */
#define is_space(c) (c == ' ' || c == '\t')

    while(len > 0 && is_space(*p)) {
        len--;
        p++;
    }

    char *start = p;
    char *end = p;

    while(len > 0 && *p != '\n') {
        if(!is_space(*p)) {
            end = p;
        }
        len--;
        p++;
    }

#undef is_space

    end[len == 0 ? 0 : 1] = '\0';
    return start;
}